

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O2

int MPIABI_Ineighbor_alltoallw
              (void *sendbuf,int *sendcounts,MPIABI_Aint *sdispls,MPIABI_Datatype *sendtypes,
              void *recvbuf,int *recvcounts,MPIABI_Aint *rdispls,MPIABI_Datatype *recvtypes,
              MPIABI_Comm comm,MPIABI_Request *request)

{
  int iVar1;
  
  iVar1 = MPI_Ineighbor_alltoallw();
  return iVar1;
}

Assistant:

int MPIABI_Ineighbor_alltoallw(
    const void *sendbuf, const int sendcounts[], const MPIABI_Aint sdispls[],
    const MPIABI_Datatype sendtypes[], void *recvbuf, const int recvcounts[],
    const MPIABI_Aint rdispls[], const MPIABI_Datatype recvtypes[],
    MPIABI_Comm comm, MPIABI_Request *request) {
  if (sizeof(MPI_Datatype) == sizeof(MPIABI_Datatype))
    return MPI_Ineighbor_alltoallw(
        sendbuf, sendcounts, (const MPI_Aint *)sdispls,
        (const MPI_Datatype *)sendtypes, recvbuf, recvcounts,
        (const MPI_Aint *)rdispls, (const MPI_Datatype *)recvtypes,
        (MPI_Comm)comm, (MPI_Request *)request);
  int comm_size;
  MPI_Comm_size((WPI_Comm)comm, &comm_size);
  std::vector<MPI_Datatype> stypes(comm_size);
  for (int i = 0; i < comm_size; ++i)
    stypes[i] = (WPI_Datatype)sendtypes[i];
  std::vector<MPI_Datatype> rtypes(comm_size);
  for (int i = 0; i < comm_size; ++i)
    rtypes[i] = (WPI_Datatype)recvtypes[i];
  const int ierr = MPI_Ineighbor_alltoallw(
      sendbuf, sendcounts, (const MPI_Aint *)sdispls, stypes.data(), recvbuf,
      recvcounts, (const MPI_Aint *)rdispls, rtypes.data(), (WPI_Comm)comm,
      (WPI_RequestPtr)request);
  return ierr;
}